

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig
          (cmInstallImportedRuntimeArtifactsGenerator *this,ostream *os,string *config,Indent indent
          )

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  bool bVar2;
  TargetType TVar3;
  ulong uVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_860;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_821;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  iterator local_7f8;
  size_type local_7f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7e8;
  string local_7d0;
  int local_7b0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  iterator local_780;
  size_type local_778;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_770;
  string local_758;
  cmAlphaNum local_738;
  cmAlphaNum local_708;
  undefined1 local_6d8 [8];
  string bundlePath_1;
  string bundleName_1;
  string bundleDir_1;
  RegularExpressionMatch match_2;
  string local_5c8;
  cmAlphaNum local_5a8;
  string local_578;
  cmAlphaNum local_558;
  undefined1 local_528 [8];
  string soNameFile;
  string soName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  iterator local_4b8;
  size_type local_4b0;
  undefined1 local_4a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  iterator local_460;
  size_type local_458;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  string local_438;
  cmAlphaNum local_418;
  cmAlphaNum local_3e8;
  undefined1 local_3b8 [8];
  string frameworkPath;
  string frameworkName;
  string frameworkDir;
  RegularExpressionMatch match_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  iterator local_280;
  size_type local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  string local_258;
  int local_238;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  iterator local_208;
  size_type local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  string local_1e0;
  cmAlphaNum local_1c0;
  cmAlphaNum local_190;
  undefined1 local_160 [8];
  string bundlePath;
  string bundleName;
  string bundleDir;
  RegularExpressionMatch match;
  undefined1 local_48 [8];
  string location;
  string *config_local;
  ostream *os_local;
  cmInstallImportedRuntimeArtifactsGenerator *this_local;
  Indent indent_local;
  
  location.field_2._8_8_ = config;
  cmGeneratorTarget::GetFullPath((string *)local_48,this->Target,config,RuntimeBinaryArtifact,false)
  ;
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if (TVar3 == EXECUTABLE) {
    bVar2 = cmGeneratorTarget::IsBundleOnApple(this->Target);
    if (bVar2) {
      cmsys::RegularExpressionMatch::RegularExpressionMatch
                ((RegularExpressionMatch *)((long)&bundleDir.field_2 + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::BundleRegularExpression,pcVar5,
                         (RegularExpressionMatch *)((long)&bundleDir.field_2 + 8));
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&bundleName.field_2 + 8),
                   (RegularExpressionMatch *)((long)&bundleDir.field_2 + 8),1);
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&bundlePath.field_2 + 8),
                   (RegularExpressionMatch *)((long)&bundleDir.field_2 + 8),2);
        cmAlphaNum::cmAlphaNum(&local_190,(string *)((long)&bundleName.field_2 + 8));
        cmAlphaNum::cmAlphaNum(&local_1c0,(string *)((long)&bundlePath.field_2 + 8));
        cmStrCat<char[5]>((string *)local_160,&local_190,&local_1c0,(char (*) [5])".app");
        GetDestination(&local_1e0,this,(string *)location.field_2._8_8_);
        local_230 = &local_228;
        std::__cxx11::string::string((string *)local_230,(string *)local_160);
        local_208 = &local_228;
        local_200 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_231);
        __l_04._M_len = local_200;
        __l_04._M_array = local_208;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1f8,__l_04,&local_231);
        bVar2 = this->Optional;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        local_238 = indent.Level;
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,&local_1e0,cmInstallType_DIRECTORY,&local_1f8,
                   (bool)(bVar2 & 1),(char *)0x0,pcVar5,(char *)0x0," USE_SOURCE_PERMISSIONS",indent
                   ,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1f8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_231);
        local_860 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208;
        do {
          local_860 = local_860 + -1;
          std::__cxx11::string::~string((string *)local_860);
        } while (local_860 != &local_228);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)local_160);
        std::__cxx11::string::~string((string *)(bundlePath.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(bundleName.field_2._M_local_buf + 8));
      }
    }
    else {
      GetDestination(&local_258,this,(string *)location.field_2._8_8_);
      std::__cxx11::string::string((string *)&local_2a0,(string *)local_48);
      local_280 = &local_2a0;
      local_278 = 1;
      paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&match_1.searchstring + 7);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(paVar1);
      __l_03._M_len = local_278;
      __l_03._M_array = local_280;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_270,__l_03,paVar1);
      bVar2 = this->Optional;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      match_1.searchstring._0_4_ = indent.Level;
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_258,cmInstallType_EXECUTABLE,&local_270,
                 (bool)(bVar2 & 1),pcVar5,(char *)0x0,(char *)0x0,(char *)0x0,indent,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_270);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&match_1.searchstring + 7));
      local_8b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280;
      do {
        local_8b8 = local_8b8 + -1;
        std::__cxx11::string::~string((string *)local_8b8);
      } while (local_8b8 != &local_2a0);
      std::__cxx11::string::~string((string *)&local_258);
    }
  }
  else if (TVar3 == SHARED_LIBRARY) {
    bVar2 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
    if (bVar2) {
      cmsys::RegularExpressionMatch::RegularExpressionMatch
                ((RegularExpressionMatch *)((long)&frameworkDir.field_2 + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::FrameworkRegularExpression,
                         pcVar5,(RegularExpressionMatch *)((long)&frameworkDir.field_2 + 8));
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&frameworkName.field_2 + 8),
                   (RegularExpressionMatch *)((long)&frameworkDir.field_2 + 8),1);
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&frameworkPath.field_2 + 8),
                   (RegularExpressionMatch *)((long)&frameworkDir.field_2 + 8),2);
        cmAlphaNum::cmAlphaNum(&local_3e8,(string *)((long)&frameworkName.field_2 + 8));
        cmAlphaNum::cmAlphaNum(&local_418,(string *)((long)&frameworkPath.field_2 + 8));
        cmStrCat<char[11]>((string *)local_3b8,&local_3e8,&local_418,(char (*) [11])".framework");
        GetDestination(&local_438,this,(string *)location.field_2._8_8_);
        std::__cxx11::string::string((string *)&local_480,(string *)local_3b8);
        local_460 = &local_480;
        local_458 = 1;
        paVar1 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(paVar1);
        __l_02._M_len = local_458;
        __l_02._M_array = local_460;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_450,__l_02,paVar1);
        bVar2 = this->Optional;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = indent.Level;
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,&local_438,cmInstallType_DIRECTORY,&local_450,
                   (bool)(bVar2 & 1),(char *)0x0,pcVar5,(char *)0x0," USE_SOURCE_PERMISSIONS",indent
                   ,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_450);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&files.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_918 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_460;
        do {
          local_918 = local_918 + -1;
          std::__cxx11::string::~string((string *)local_918);
        } while (local_918 != &local_480);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)local_3b8);
        std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(frameworkName.field_2._M_local_buf + 8));
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_4d8,(string *)local_48);
      local_4b8 = &local_4d8;
      local_4b0 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(soName.field_2._M_local_buf + 0xf));
      __l_01._M_len = local_4b0;
      __l_01._M_array = local_4b8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4a8,__l_01,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(soName.field_2._M_local_buf + 0xf));
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(soName.field_2._M_local_buf + 0xf));
      local_960 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b8;
      do {
        local_960 = local_960 + -1;
        std::__cxx11::string::~string((string *)local_960);
      } while (local_960 != &local_4d8);
      cmGeneratorTarget::GetSOName
                ((string *)((long)&soNameFile.field_2 + 8),this->Target,
                 (string *)location.field_2._8_8_);
      cmGeneratorTarget::GetDirectory
                (&local_578,this->Target,(string *)location.field_2._8_8_,RuntimeBinaryArtifact);
      cmAlphaNum::cmAlphaNum(&local_558,&local_578);
      cmAlphaNum::cmAlphaNum(&local_5a8,'/');
      cmStrCat<std::__cxx11::string>
                ((string *)local_528,&local_558,&local_5a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&soNameFile.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_578);
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_528,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48), bVar2)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4a8,(value_type *)local_528);
      }
      GetDestination(&local_5c8,this,(string *)location.field_2._8_8_);
      bVar2 = this->Optional;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_5c8,cmInstallType_SHARED_LIBRARY,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4a8,(bool)(bVar2 & 1),pcVar5,(char *)0x0,(char *)0x0,(char *)0x0,indent,
                 (char *)0x0);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)local_528);
      std::__cxx11::string::~string((string *)(soNameFile.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4a8);
    }
  }
  else {
    if (TVar3 != MODULE_LIBRARY) {
      __assert_fail("false && \"This should never happen\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallImportedRuntimeArtifactsGenerator.cxx"
                    ,0x8f,
                    "virtual void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                   );
    }
    bVar2 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
    if (bVar2) {
      cmsys::RegularExpressionMatch::RegularExpressionMatch
                ((RegularExpressionMatch *)((long)&bundleDir_1.field_2 + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::CFBundleRegularExpression,
                         pcVar5,(RegularExpressionMatch *)((long)&bundleDir_1.field_2 + 8));
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&bundleName_1.field_2 + 8),
                   (RegularExpressionMatch *)((long)&bundleDir_1.field_2 + 8),1);
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  ((string *)((long)&bundlePath_1.field_2 + 8),
                   (RegularExpressionMatch *)((long)&bundleDir_1.field_2 + 8),2);
        cmAlphaNum::cmAlphaNum(&local_708,(string *)((long)&bundleName_1.field_2 + 8));
        cmAlphaNum::cmAlphaNum(&local_738,(string *)((long)&bundlePath_1.field_2 + 8));
        cmStrCat<char[8]>((string *)local_6d8,&local_708,&local_738,(char (*) [8])".bundle");
        GetDestination(&local_758,this,(string *)location.field_2._8_8_);
        local_7a8 = &local_7a0;
        std::__cxx11::string::string((string *)local_7a8,(string *)local_6d8);
        local_780 = &local_7a0;
        local_778 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_7a9);
        __l_00._M_len = local_778;
        __l_00._M_array = local_780;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_770,__l_00,&local_7a9);
        bVar2 = this->Optional;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        local_7b0 = indent.Level;
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,&local_758,cmInstallType_DIRECTORY,&local_770,
                   (bool)(bVar2 & 1),(char *)0x0,pcVar5,(char *)0x0," USE_SOURCE_PERMISSIONS",indent
                   ,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_770);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_7a9);
        local_9c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_780;
        do {
          local_9c8 = local_9c8 + -1;
          std::__cxx11::string::~string((string *)local_9c8);
        } while (local_9c8 != &local_7a0);
        std::__cxx11::string::~string((string *)&local_758);
        std::__cxx11::string::~string((string *)local_6d8);
        std::__cxx11::string::~string((string *)(bundlePath_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(bundleName_1.field_2._M_local_buf + 8));
      }
    }
    else {
      GetDestination(&local_7d0,this,(string *)location.field_2._8_8_);
      local_820 = &local_818;
      std::__cxx11::string::string((string *)local_820,(string *)local_48);
      local_7f8 = &local_818;
      local_7f0 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_821);
      __l._M_len = local_7f0;
      __l._M_array = local_7f8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_7e8,__l,&local_821);
      bVar2 = this->Optional;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_7d0,cmInstallType_MODULE_LIBRARY,
                 &local_7e8,(bool)(bVar2 & 1),pcVar5,(char *)0x0,(char *)0x0,(char *)0x0,indent,
                 (char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_7e8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_821);
      local_a20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7f8;
      do {
        local_a20 = local_a20 + -1;
        std::__cxx11::string::~string((string *)local_a20);
      } while (local_a20 != &local_818);
      std::__cxx11::string::~string((string *)&local_7d0);
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  auto location = this->Target->GetFullPath(config);

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      if (this->Target->IsBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (BundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".app");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_EXECUTABLE, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::SHARED_LIBRARY:
      if (this->Target->IsFrameworkOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (FrameworkRegularExpression.find(location.c_str(), match)) {
          auto frameworkDir = match.match(1);
          auto frameworkName = match.match(2);
          auto frameworkPath =
            cmStrCat(frameworkDir, frameworkName, ".framework");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { frameworkPath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        std::vector<std::string> files{ location };
        auto soName = this->Target->GetSOName(config);
        auto soNameFile =
          cmStrCat(this->Target->GetDirectory(config), '/', soName);
        if (!soName.empty() && soNameFile != location) {
          files.push_back(soNameFile);
        }
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_SHARED_LIBRARY, files,
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::MODULE_LIBRARY:
      if (this->Target->IsCFBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (CFBundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".bundle");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_MODULE_LIBRARY, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    default:
      assert(false && "This should never happen");
      break;
  }
}